

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O3

void __thiscall
cmGeneratorExpressionDAGChecker::ReportError
          (cmGeneratorExpressionDAGChecker *this,cmGeneratorExpressionContext *context,string *expr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ostream *poVar3;
  cmake *pcVar4;
  cmGeneratorExpressionDAGChecker *pcVar5;
  int iVar6;
  ostringstream e;
  string local_1d0;
  string *local_1b0;
  undefined1 local_1a8 [376];
  
  if ((this->CheckResult != DAG) && (context->HadError = true, context->Quiet == false)) {
    pcVar5 = this->Parent;
    local_1b0 = expr;
    if ((pcVar5 == (cmGeneratorExpressionDAGChecker *)0x0) ||
       (pcVar5->Parent != (cmGeneratorExpressionDAGChecker *)0x0)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Error evaluating generator expression:\n",0x27);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(local_1b0->_M_dataplus)._M_p,
                          local_1b0->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Dependency loop found.",0x16);
      pcVar4 = cmMakefile::GetCMakeInstance(context->Makefile);
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(pcVar4,FATAL_ERROR,&local_1d0,&context->Backtrace);
      paVar1 = &local_1d0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      if (pcVar5 != (cmGeneratorExpressionDAGChecker *)0x0) {
        iVar6 = 1;
        do {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Loop step ",10);
          poVar3 = (ostream *)std::ostream::operator<<((ostringstream *)local_1a8,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
          if (pcVar5->Content == (GeneratorExpressionContent *)0x0) {
            pcVar2 = (local_1b0->_M_dataplus)._M_p;
            local_1d0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1d0,pcVar2,pcVar2 + local_1b0->_M_string_length);
          }
          else {
            GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_1d0,pcVar5->Content)
            ;
          }
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          pcVar4 = cmMakefile::GetCMakeInstance(context->Makefile);
          std::__cxx11::stringbuf::str();
          cmake::IssueMessage(pcVar4,FATAL_ERROR,&local_1d0,&pcVar5->Backtrace);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          pcVar5 = pcVar5->Parent;
          iVar6 = iVar6 + 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        } while (pcVar5 != (cmGeneratorExpressionDAGChecker *)0x0);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Error evaluating generator expression:\n",0x27);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(local_1b0->_M_dataplus)._M_p,
                          local_1b0->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Self reference on target \"",0x1a);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(context->HeadTarget->Name)._M_dataplus._M_p,
                          (context->HeadTarget->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\".\n",3);
      pcVar4 = cmMakefile::GetCMakeInstance(context->Makefile);
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(pcVar4,FATAL_ERROR,&local_1d0,&pcVar5->Backtrace);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    }
  }
  return;
}

Assistant:

void cmGeneratorExpressionDAGChecker::ReportError(
                  cmGeneratorExpressionContext *context,
                  const std::string &expr)
{
  if (this->CheckResult == DAG)
    {
    return;
    }

  context->HadError = true;
  if (context->Quiet)
    {
    return;
    }

  const cmGeneratorExpressionDAGChecker *parent = this->Parent;

  if (parent && !parent->Parent)
    {
    std::ostringstream e;
    e << "Error evaluating generator expression:\n"
      << "  " << expr << "\n"
      << "Self reference on target \""
      << context->HeadTarget->GetName() << "\".\n";
    context->Makefile->GetCMakeInstance()
      ->IssueMessage(cmake::FATAL_ERROR, e.str(),
                      parent->Backtrace);
    return;
    }

  {
  std::ostringstream e;
  e << "Error evaluating generator expression:\n"
    << "  " << expr << "\n"
    << "Dependency loop found.";
  context->Makefile->GetCMakeInstance()
    ->IssueMessage(cmake::FATAL_ERROR, e.str(),
                    context->Backtrace);
  }

  int loopStep = 1;
  while (parent)
    {
    std::ostringstream e;
    e << "Loop step " << loopStep << "\n"
      << "  "
      << (parent->Content ? parent->Content->GetOriginalExpression() : expr)
      << "\n";
    context->Makefile->GetCMakeInstance()
      ->IssueMessage(cmake::FATAL_ERROR, e.str(),
                      parent->Backtrace);
    parent = parent->Parent;
    ++loopStep;
    }
}